

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O3

pid_t dep_monitor(char *file)

{
  job_t *pjVar1;
  undefined8 uVar2;
  __pid_t _Var3;
  int __fd;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  job_t *job;
  sigset_t hup;
  sigset_t sStack_a8;
  
  _Var3 = fork();
  if (_Var3 == -1) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    syslog(3,"fork: %s\n",pcVar6);
  }
  else if (_Var3 < 1) {
    prctl(0xf,"pmtr-dep");
    close_sockets(&cfg);
    __fd = inotify_init();
    if (__fd != -1) {
      iVar4 = inotify_add_watch(__fd,file,8);
      if (iVar4 == -1) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        syslog(3,"can\'t watch %s: %s",file,pcVar6);
        sleep(10);
        exit(-1);
      }
      job = (job_t *)0x0;
LAB_001075d3:
      do {
        uVar10 = (ulong)(cfg.jobs)->i;
        if (job == (job_t *)0x0) {
          if (uVar10 == 0) goto LAB_001076f3;
          job = (job_t *)(cfg.jobs)->d;
        }
        else {
          pjVar1 = (job_t *)(cfg.jobs)->d;
          if (job < pjVar1) {
            if (uVar10 == 0) {
LAB_001076f3:
              signal(1,(__sighandler_t)0x0);
              prctl(1,1);
              sigemptyset(&sStack_a8);
              sigaddset(&sStack_a8,1);
              sigprocmask(1,&sStack_a8,(sigset_t *)0x0);
              read(__fd,&cfg.eb,0x1010);
              nanosleep((timespec *)&halfsec,(timespec *)0x0);
              _Var3 = getppid();
              kill(_Var3,1);
              exit(0);
            }
            uVar9 = ((cfg.jobs)->icd).sz;
            uVar7 = 0;
          }
          else {
            uVar9 = ((cfg.jobs)->icd).sz;
            uVar7 = (ulong)((long)job - (long)pjVar1) / uVar9 + 1;
            if (uVar10 <= uVar7) goto LAB_001076f3;
          }
          job = (job_t *)((long)&pjVar1->name + uVar9 * uVar7);
        }
        if (job == (job_t *)0x0) goto LAB_001076f3;
        if (job->disabled == 0) {
          pcVar6 = (char *)0x0;
LAB_00107642:
          uVar10 = (ulong)(job->depv).i;
          if (pcVar6 == (char *)0x0) {
            if (uVar10 == 0) goto LAB_001075d3;
            pcVar6 = (job->depv).d;
          }
          else {
            pcVar8 = (job->depv).d;
            if (pcVar6 < pcVar8) {
              if (uVar10 == 0) goto LAB_001075d3;
              uVar9 = (job->depv).icd.sz;
              uVar7 = 0;
            }
            else {
              uVar9 = (job->depv).icd.sz;
              uVar7 = (ulong)((long)pcVar6 - (long)pcVar8) / uVar9 + 1;
              if (uVar10 <= uVar7) goto LAB_001075d3;
            }
            pcVar6 = pcVar8 + uVar9 * uVar7;
          }
          if (pcVar6 == (char *)0x0) goto LAB_001075d3;
          pcVar8 = fpath(job,*(char **)pcVar6);
          iVar4 = inotify_add_watch(__fd,pcVar8,8);
          if (iVar4 == -1) {
            uVar2 = *(undefined8 *)pcVar6;
            piVar5 = __errno_location();
            pcVar8 = strerror(*piVar5);
            syslog(3,"can\'t watch %s: %s",uVar2,pcVar8);
          }
          goto LAB_00107642;
        }
      } while( true );
    }
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    syslog(3,"inotify_init: %s",pcVar6);
    pcVar6 = (char *)0x0;
    do {
      uVar10 = (ulong)(cfg.jobs)->i;
      if (pcVar6 == (char *)0x0) {
        if (uVar10 == 0) goto LAB_001075bf;
        pcVar6 = (cfg.jobs)->d;
      }
      else {
        pcVar8 = (cfg.jobs)->d;
        if (pcVar6 < pcVar8) {
          if (uVar10 == 0) {
LAB_001075bf:
            exit(0x21);
          }
          uVar9 = ((cfg.jobs)->icd).sz;
          uVar7 = 0;
        }
        else {
          uVar9 = ((cfg.jobs)->icd).sz;
          uVar7 = (ulong)((long)pcVar6 - (long)pcVar8) / uVar9 + 1;
          if (uVar10 <= uVar7) goto LAB_001075bf;
        }
        pcVar6 = pcVar8 + uVar9 * uVar7;
      }
      if (pcVar6 == (char *)0x0) goto LAB_001075bf;
      if ((*(int *)(pcVar6 + 0x184) == 0) && (*(int *)(pcVar6 + 0x68) != 0)) {
        syslog(3,"job %s: dependency watching disabled",*(undefined8 *)pcVar6);
      }
    } while( true );
  }
  return _Var3;
}

Assistant:

pid_t dep_monitor(char *file) {
  int rc, fd, wd, sc;
  pid_t pid;

  pid = fork();

  if (pid == (pid_t)-1) {
    syslog(LOG_ERR, "fork: %s\n", strerror(errno));
    return (pid_t)-1;
  }

  if (pid > 0) return pid;

  /* child here */
  prctl(PR_SET_NAME, "pmtr-dep");
  close_sockets(&cfg);

  /* This sub-process monitors pmtr.conf for changes, and also any
   * files explicitly named by the "depends" keyword. It is based on
   * inotify in Linux. In some situations, inotify is not available,
   * e.g., in a Linux container on a Mac host that mounts a host folder.
   * Log if inotify initialization fails but treat this as non-fatal. */
  fd = inotify_init();
  if (fd == -1) {
    syslog(LOG_ERR, "inotify_init: %s", strerror(errno)); 
    job_t *job=NULL;
    while ( (job=(job_t*)utarray_next(cfg.jobs,job))) {
      if (job->disabled) continue;
      if (utarray_len(&job->depv) > 0) {
        syslog(LOG_ERR, "job %s: dependency watching disabled", job->name);
      }
    }
    exit(PMTR_NO_RESTART); /* don't restart the dep_monitor process */
  }

  wd = inotify_add_watch(fd, file, IN_CLOSE_WRITE);
  if (wd == -1) {
    syslog(LOG_ERR, "can't watch %s: %s", file, strerror(errno)); 
    sleep(SHORT_DELAY);  /* pmtr.conf unlinked pending rewrite? */
    exit(-1);            /* parent will restart us to try again */
  }

  /* loop over jobs' dependencies, adding watch on each one. if one
   * is missing, we log the error but not fatally, because parent
   * detects this situation and disables the job */
  job_t *job=NULL;
  while ( (job=(job_t*)utarray_next(cfg.jobs,job))) {
    if (job->disabled) continue;
    char **dep=NULL;
    while ( (dep=(char**)utarray_next(&job->depv,dep))) {
      sc = inotify_add_watch(fd, fpath(job,*dep), IN_CLOSE_WRITE);
      if (sc == -1) syslog(LOG_ERR,"can't watch %s: %s", *dep, strerror(errno));
    }
  }

  /* request HUP if parent exits, unblock, action terminate */
  signal(SIGHUP, SIG_DFL);
  prctl(PR_SET_PDEATHSIG, SIGHUP);
  sigset_t hup; sigemptyset(&hup); sigaddset(&hup,SIGHUP);
  sigprocmask(SIG_UNBLOCK,&hup,NULL);

  /* block for any inotify event. when one happens, notify parent */
  rc = read(fd, &cfg.eb, sizeof(cfg.eb));
  nanosleep(&halfsec,NULL);
  kill(getppid(), SIGHUP);
  exit(0);
}